

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void verifyOrthonormal<double>(Matrix33<double> *A)

{
  double *pdVar1;
  int i;
  long lVar2;
  double *pdVar3;
  int j;
  long lVar4;
  double *pdVar5;
  int k;
  long lVar6;
  double dVar7;
  Matrix33<double> prod;
  double local_98 [12];
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  double local_8;
  
  pdVar1 = local_98;
  local_98[10] = A->x[0][0];
  local_98[0xb] = A->x[1][0];
  local_38 = A->x[2][0];
  local_30 = A->x[0][1];
  local_28 = A->x[1][1];
  local_20 = A->x[2][1];
  local_18 = A->x[0][2];
  local_10 = A->x[1][2];
  local_8 = A->x[2][2];
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  local_98[8] = 0.0;
  lVar2 = 0;
  do {
    lVar4 = 0;
    pdVar3 = local_98 + 10;
    do {
      dVar7 = local_98[lVar2 * 3 + lVar4];
      lVar6 = 0;
      pdVar5 = pdVar3;
      do {
        dVar7 = dVar7 + (*(double (*) [3])*(double (*) [3])A)[lVar6] * *pdVar5;
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar6 != 3);
      local_98[lVar2 * 3 + lVar4] = dVar7;
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    A = (Matrix33<double> *)((long)A + 0x18);
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      if (lVar2 == lVar4) {
        if (2.220446049250313e-14 <= ABS(local_98[lVar2 * 4] + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) < valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x3a,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = double]")
          ;
        }
      }
      else if (2.220446049250313e-14 <= ABS(*(double *)((long)pdVar1 + lVar4 * 8))) {
        __assert_fail("std::abs (prod[i][j]) < valueEps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                      ,0x3c,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = double]");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    pdVar1 = (double *)((long)pdVar1 + 0x18);
  } while (lVar2 != 3);
  return;
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}